

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)4>,false>
          (Thread *this)

{
  uint uVar1;
  uint uVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  uint *puVar3;
  unsigned_long *puVar4;
  byte local_41;
  undefined1 auStack_40 [6];
  u8 laneidx;
  u8 i;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  for (local_41 = 0; local_41 < 2; local_41 = local_41 + 1) {
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)(result.v + 1),local_41 + 2);
    uVar1 = *puVar3;
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)(lhs.v + 2),local_41 + 2);
    uVar2 = *puVar3;
    puVar4 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)auStack_40,local_41);
    *puVar4 = (ulong)uVar1 * (ulong)uVar2;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_40;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}